

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRGenerator.cc
# Opt level: O0

int __thiscall
flow::lang::IRGenerator::accept(IRGenerator *this,int __fd,sockaddr *__addr,socklen_t *__addr_len)

{
  initializer_list<std::pair<const_int,_flow::Value_*(flow::lang::IRGenerator::*)(flow::Value_*,_flow::Value_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>
  __l;
  FILE *__stream;
  const_iterator cVar1;
  bool bVar2;
  Opcode OVar3;
  int iVar4;
  BasicBlock *pBVar5;
  ConstantInt *arraySize;
  Value *pVVar6;
  Expr *pEVar7;
  Value *pVVar8;
  pointer pvVar9;
  char *pcVar10;
  long *plVar11;
  undefined4 in_register_00000034;
  IRBuilder *pIVar12;
  code *local_5a0;
  allocator<char> local_4c1;
  string local_4c0 [32];
  _Node_iterator_base<std::pair<const_int,_flow::Value_*(flow::lang::IRGenerator::*)(flow::Value_*,_flow::Value_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_false>
  local_4a0;
  uint local_494;
  _Node_iterator_base<std::pair<const_int,_flow::Value_*(flow::lang::IRGenerator::*)(flow::Value_*,_flow::Value_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_false>
  local_490;
  const_iterator i;
  Value *rhs;
  Value *lhs;
  string local_470;
  Value *local_450;
  Value *rhs_1;
  string local_440;
  Value *local_420;
  Value *lhs_1;
  string local_410;
  Value *local_3f0;
  AllocaInstr *result;
  string local_3e0;
  BasicBlock *local_3c0;
  BasicBlock *borCont;
  string local_3b0;
  BasicBlock *local_390;
  BasicBlock *borRight;
  string local_380;
  BasicBlock *local_360;
  BasicBlock *borLeft;
  allocator<std::pair<const_int,_flow::Value_*(flow::lang::IRGenerator::*)(flow::Value_*,_flow::Value_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>
  local_343;
  key_equal local_342;
  hasher local_341;
  pair<const_int,_flow::Value_*(flow::lang::IRGenerator::*)(flow::Value_*,_flow::Value_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_340 [33];
  iterator local_28;
  size_type local_20;
  BinaryExpr *local_18;
  BinaryExpr *expr_local;
  IRGenerator *this_local;
  
  local_18 = (BinaryExpr *)CONCAT44(in_register_00000034,__fd);
  expr_local = (BinaryExpr *)this;
  if ((accept(flow::lang::BinaryExpr&)::ops_abi_cxx11_ == '\0') &&
     (iVar4 = __cxa_guard_acquire(&accept(flow::lang::BinaryExpr&)::ops_abi_cxx11_), iVar4 != 0)) {
    memcpy(local_340,&DAT_002c8ec8,0x318);
    local_20 = 0x21;
    local_28 = local_340;
    std::
    allocator<std::pair<const_int,_flow::Value_*(flow::lang::IRGenerator::*)(flow::Value_*,_flow::Value_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>
    ::allocator(&local_343);
    __l._M_len = local_20;
    __l._M_array = local_28;
    std::
    unordered_map<int,_flow::Value_*(flow::lang::IRGenerator::*)(flow::Value_*,_flow::Value_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_flow::Value_*(flow::lang::IRGenerator::*)(flow::Value_*,_flow::Value_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>_>
    ::unordered_map(&accept(flow::lang::BinaryExpr&)::ops_abi_cxx11_,__l,0,&local_341,&local_342,
                    &local_343);
    std::
    allocator<std::pair<const_int,_flow::Value_*(flow::lang::IRGenerator::*)(flow::Value_*,_flow::Value_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>
    ::~allocator(&local_343);
    __cxa_atexit(std::
                 unordered_map<int,_flow::Value_*(flow::lang::IRGenerator::*)(flow::Value_*,_flow::Value_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_flow::Value_*(flow::lang::IRGenerator::*)(flow::Value_*,_flow::Value_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>_>
                 ::~unordered_map,&accept(flow::lang::BinaryExpr&)::ops_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&accept(flow::lang::BinaryExpr&)::ops_abi_cxx11_);
  }
  OVar3 = BinaryExpr::op(local_18);
  if (OVar3 == BOR) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_380,"bor.left",(allocator<char> *)((long)&borRight + 7));
    pBVar5 = IRBuilder::createBlock(&this->super_IRBuilder,&local_380);
    std::__cxx11::string::~string((string *)&local_380);
    std::allocator<char>::~allocator((allocator<char> *)((long)&borRight + 7));
    local_360 = pBVar5;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_3b0,"bor.right",(allocator<char> *)((long)&borCont + 7));
    pBVar5 = IRBuilder::createBlock(&this->super_IRBuilder,&local_3b0);
    std::__cxx11::string::~string((string *)&local_3b0);
    std::allocator<char>::~allocator((allocator<char> *)((long)&borCont + 7));
    local_390 = pBVar5;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_3e0,"bor.cont",(allocator<char> *)((long)&result + 7));
    pBVar5 = IRBuilder::createBlock(&this->super_IRBuilder,&local_3e0);
    std::__cxx11::string::~string((string *)&local_3e0);
    std::allocator<char>::~allocator((allocator<char> *)((long)&result + 7));
    local_3c0 = pBVar5;
    arraySize = IRBuilder::get(&this->super_IRBuilder,1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_410,"bor",(allocator<char> *)((long)&lhs_1 + 7));
    pVVar6 = (Value *)IRBuilder::createAlloca
                                (&this->super_IRBuilder,Boolean,(Value *)arraySize,&local_410);
    std::__cxx11::string::~string((string *)&local_410);
    std::allocator<char>::~allocator((allocator<char> *)((long)&lhs_1 + 7));
    local_3f0 = pVVar6;
    pEVar7 = BinaryExpr::leftExpr(local_18);
    local_420 = codegen(this,pEVar7);
    pIVar12 = &this->super_IRBuilder;
    IRBuilder::createCondBr(pIVar12,local_420,local_360,local_390);
    IRBuilder::setInsertPoint(pIVar12,local_360);
    pVVar8 = local_3f0;
    pVVar6 = local_420;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_440,"bor.left",(allocator<char> *)((long)&rhs_1 + 7));
    IRBuilder::createStore(pIVar12,pVVar8,pVVar6,&local_440);
    std::__cxx11::string::~string((string *)&local_440);
    std::allocator<char>::~allocator((allocator<char> *)((long)&rhs_1 + 7));
    pIVar12 = &this->super_IRBuilder;
    IRBuilder::createBr(pIVar12,local_3c0);
    IRBuilder::setInsertPoint(pIVar12,local_390);
    pEVar7 = BinaryExpr::rightExpr(local_18);
    pVVar8 = codegen(this,pEVar7);
    pVVar6 = local_3f0;
    local_450 = pVVar8;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_470,"bor.right",(allocator<char> *)((long)&lhs + 7));
    IRBuilder::createStore(pIVar12,pVVar6,pVVar8,&local_470);
    std::__cxx11::string::~string((string *)&local_470);
    std::allocator<char>::~allocator((allocator<char> *)((long)&lhs + 7));
    IRBuilder::createBr(&this->super_IRBuilder,local_3c0);
    IRBuilder::setInsertPoint(&this->super_IRBuilder,local_3c0);
    this->result_ = local_3f0;
  }
  else {
    pEVar7 = BinaryExpr::leftExpr(local_18);
    pVVar6 = codegen(this,pEVar7);
    pEVar7 = BinaryExpr::rightExpr(local_18);
    i.
    super__Node_iterator_base<std::pair<const_int,_flow::Value_*(flow::lang::IRGenerator::*)(flow::Value_*,_flow::Value_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_false>
    ._M_cur = (_Node_iterator_base<std::pair<const_int,_flow::Value_*(flow::lang::IRGenerator::*)(flow::Value_*,_flow::Value_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_false>
               )codegen(this,pEVar7);
    OVar3 = BinaryExpr::op(local_18);
    local_494 = (uint)OVar3;
    local_490._M_cur =
         (__node_type *)
         std::
         unordered_map<int,_flow::Value_*(flow::lang::IRGenerator::*)(flow::Value_*,_flow::Value_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_flow::Value_*(flow::lang::IRGenerator::*)(flow::Value_*,_flow::Value_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>_>
         ::find(&accept(flow::lang::BinaryExpr&)::ops_abi_cxx11_,(key_type *)&local_494);
    local_4a0._M_cur =
         (__node_type *)
         std::
         unordered_map<int,_flow::Value_*(flow::lang::IRGenerator::*)(flow::Value_*,_flow::Value_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_flow::Value_*(flow::lang::IRGenerator::*)(flow::Value_*,_flow::Value_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>_>
         ::end(&accept(flow::lang::BinaryExpr&)::ops_abi_cxx11_);
    bVar2 = std::__detail::operator!=(&local_490,&local_4a0);
    __stream = _stderr;
    if (!bVar2) {
      OVar3 = BinaryExpr::op(local_18);
      pcVar10 = mnemonic(OVar3);
      fprintf(__stream,"BUG: Binary operation `%s` not implemented.\n",pcVar10);
      __assert_fail("!\"Unimplemented\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/christianparpart[P]flow/src/flow/lang/IRGenerator.cc"
                    ,0x127,"virtual void flow::lang::IRGenerator::accept(BinaryExpr &)");
    }
    pvVar9 = std::__detail::
             _Node_const_iterator<std::pair<const_int,_flow::Value_*(flow::lang::IRGenerator::*)(flow::Value_*,_flow::Value_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_false,_false>
             ::operator->((_Node_const_iterator<std::pair<const_int,_flow::Value_*(flow::lang::IRGenerator::*)(flow::Value_*,_flow::Value_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_false,_false>
                           *)&local_490);
    cVar1 = i;
    local_5a0 = (code *)pvVar9->second;
    plVar11 = (long *)((long)&(this->super_ASTVisitor)._vptr_ASTVisitor +
                      *(long *)&pvVar9->field_0x10);
    if (((ulong)local_5a0 & 1) != 0) {
      local_5a0 = *(code **)(local_5a0 + *plVar11 + -1);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_4c0,"",&local_4c1);
    pVVar6 = (Value *)(*local_5a0)(plVar11,pVVar6,
                                   cVar1.
                                   super__Node_iterator_base<std::pair<const_int,_flow::Value_*(flow::lang::IRGenerator::*)(flow::Value_*,_flow::Value_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_false>
                                   ._M_cur,local_4c0);
    this->result_ = pVVar6;
    std::__cxx11::string::~string(local_4c0);
    this = (IRGenerator *)std::allocator<char>::~allocator(&local_4c1);
  }
  return (int)this;
}

Assistant:

void IRGenerator::accept(BinaryExpr& expr) {
  static const std::unordered_map<
      int /*Opcode*/,
      Value* (IRGenerator::*)(Value*, Value*, const std::string&)> ops =
      {// boolean
       {Opcode::BAND, &IRGenerator::createBAnd},
       {Opcode::BXOR, &IRGenerator::createBXor},
       // numerical
       {Opcode::NADD, &IRGenerator::createAdd},
       {Opcode::NSUB, &IRGenerator::createSub},
       {Opcode::NMUL, &IRGenerator::createMul},
       {Opcode::NDIV, &IRGenerator::createDiv},
       {Opcode::NREM, &IRGenerator::createRem},
       {Opcode::NSHL, &IRGenerator::createShl},
       {Opcode::NSHR, &IRGenerator::createShr},
       {Opcode::NPOW, &IRGenerator::createPow},
       {Opcode::NAND, &IRGenerator::createAnd},
       {Opcode::NOR, &IRGenerator::createOr},
       {Opcode::NXOR, &IRGenerator::createXor},
       {Opcode::NCMPEQ, &IRGenerator::createNCmpEQ},
       {Opcode::NCMPNE, &IRGenerator::createNCmpNE},
       {Opcode::NCMPLE, &IRGenerator::createNCmpLE},
       {Opcode::NCMPGE, &IRGenerator::createNCmpGE},
       {Opcode::NCMPLT, &IRGenerator::createNCmpLT},
       {Opcode::NCMPGT, &IRGenerator::createNCmpGT},

       // string
       {Opcode::SADD, &IRGenerator::createSAdd},
       {Opcode::SCMPEQ, &IRGenerator::createSCmpEQ},
       {Opcode::SCMPNE, &IRGenerator::createSCmpNE},
       {Opcode::SCMPLE, &IRGenerator::createSCmpLE},
       {Opcode::SCMPGE, &IRGenerator::createSCmpGE},
       {Opcode::SCMPLT, &IRGenerator::createSCmpLT},
       {Opcode::SCMPGT, &IRGenerator::createSCmpGT},
       {Opcode::SCMPBEG, &IRGenerator::createSCmpEB},
       {Opcode::SCMPEND, &IRGenerator::createSCmpEE},
       {Opcode::SCONTAINS, &IRGenerator::createSIn},

       // regex
       {Opcode::SREGMATCH, &IRGenerator::createSCmpRE},

       // ip
       {Opcode::PCMPEQ, &IRGenerator::createPCmpEQ},
       {Opcode::PCMPNE, &IRGenerator::createPCmpNE},
       {Opcode::PINCIDR, &IRGenerator::createPInCidr}, };

  if (expr.op() == Opcode::BOR) {
    // (lhs || rhs)
    //
    //   L = lhs();
    //   if (L) goto end;
    //   R = rhs();
    //   L = R;
    // end:
    //   result = L;

    BasicBlock* borLeft = createBlock("bor.left");
    BasicBlock* borRight = createBlock("bor.right");
    BasicBlock* borCont = createBlock("bor.cont");

    AllocaInstr* result = createAlloca(LiteralType::Boolean, get(1), "bor");
    Value* lhs = codegen(expr.leftExpr());
    createCondBr(lhs, borLeft, borRight);

    setInsertPoint(borLeft);
    createStore(result, lhs, "bor.left");
    createBr(borCont);

    setInsertPoint(borRight);
    Value* rhs = codegen(expr.rightExpr());
    createStore(result, rhs, "bor.right");
    createBr(borCont);

    setInsertPoint(borCont);

    result_ = result;

    return;
  }

  Value* lhs = codegen(expr.leftExpr());
  Value* rhs = codegen(expr.rightExpr());

  auto i = ops.find(expr.op());
  if (i != ops.end()) {
    result_ = (this->*i->second)(lhs, rhs, "");
  } else {
    fprintf(stderr, "BUG: Binary operation `%s` not implemented.\n",
            mnemonic(expr.op()));
    assert(!"Unimplemented");
    result_ = nullptr;
  }
}